

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical_deg<2,int>(Omega_h *this,Read<int> *ev2v)

{
  int size_in;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_b8;
  undefined1 local_a8 [8];
  type f;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<signed_char> codes;
  int ne;
  LO nev;
  Read<int> *ev2v_local;
  ulong local_10;
  
  if (((ulong)(ev2v->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((ev2v->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(ev2v->write_).shared_alloc_.alloc >> 3;
  }
  codes.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2);
  size_in = divide_no_remainder<int>(codes.shared_alloc_.direct_ptr._4_4_,2);
  codes.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<signed_char>::Write((Write<signed_char> *)local_50,size_in,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Read<int>::Read((Read<int> *)local_a8,ev2v);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.ev2v.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_50);
  parallel_for<Omega_h::get_codes_to_canonical_deg<2,int>(Omega_h::Read<int>)::_lambda(int)_1_>
            ((int)codes.shared_alloc_.direct_ptr,(type *)local_a8);
  Write<signed_char>::Write(&local_b8,(Write<signed_char> *)local_50);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_b8);
  Write<signed_char>::~Write(&local_b8);
  get_codes_to_canonical_deg<2,int>(Omega_h::Read<int>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_a8);
  Write<signed_char>::~Write((Write<signed_char> *)local_50);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> get_codes_to_canonical_deg(Read<T> const ev2v) {
  auto const nev = ev2v.size();
  auto const ne = divide_no_remainder(nev, deg);
  Write<I8> codes(ne);
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const begin = e * deg;
    /* find the smallest vertex */
    Int min_j = 0;
    auto min_v = ev2v[begin];
    for (Int j = 1; j < deg; ++j) {
      auto const ev = j + begin;
      auto const v = ev2v[ev];
      if (v < min_v) {
        min_j = j;
        min_v = v;
      }
    }
    /* rotate to make it first */
    auto const rotation = rotation_to_first(deg, min_j);
    T tmp[deg];
    rotate_adj<deg>(rotation, ev2v, begin, tmp, 0);
    auto const is_flipped = IsFlipped<deg>::is(tmp);
    codes[e] = make_code(is_flipped, rotation, 0);
  };
  parallel_for(ne, std::move(f));
  return codes;
}